

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O2

tuple __thiscall
pybind11::make_tuple<(pybind11::return_value_policy)1,int_const&,int_const&,int_const&>
          (pybind11 *this,int *args_,int *args__1,int *args__2)

{
  undefined8 uVar1;
  cast_error *this_00;
  long *plVar2;
  long lVar3;
  long lStack_e8;
  array<pybind11::object,_3UL> args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
  argtypes;
  
  plVar2 = &lStack_e8;
  args._M_elems[0].super_handle.m_ptr = (handle)PyLong_FromSsize_t((long)*args_);
  args._M_elems[1].super_handle.m_ptr = (handle)PyLong_FromSsize_t((long)*args__1);
  args._M_elems[2].super_handle.m_ptr = (handle)PyLong_FromSsize_t((long)*args__2);
  lVar3 = 0;
  while( true ) {
    plVar2 = plVar2 + 1;
    if (lVar3 == -0x60) {
      tuple::tuple((tuple *)this,3);
      lVar3 = 0;
      while( true ) {
        if (lVar3 == 0x18) {
          std::array<pybind11::object,_3UL>::~array(&args);
          return (object)(object)this;
        }
        uVar1 = *(undefined8 *)((long)&args._M_elems[0].super_handle.m_ptr + lVar3);
        *(undefined8 *)((long)&args._M_elems[0].super_handle.m_ptr + lVar3) = 0;
        if ((*(byte *)(*(long *)(*(long *)this + 8) + 0xab) & 4) == 0) break;
        *(undefined8 *)(*(long *)this + 0x18 + lVar3) = uVar1;
        lVar3 = lVar3 + 8;
      }
      __assert_fail("PyTuple_Check(result.ptr())",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/amlucas[P]sdfTools/src/extern/pybind11/include/pybind11/cast.h"
                    ,0x3d9,
                    "tuple pybind11::make_tuple(Args &&...) [policy = pybind11::return_value_policy::automatic_reference, Args = <const int &, const int &, const int &>]"
                   );
    }
    if (*plVar2 == 0) break;
    lVar3 = lVar3 + -0x20;
  }
  type_id<int_const&>();
  type_id<int_const&>();
  type_id<int_const&>();
  this_00 = (cast_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_c8,"make_tuple(): unable to convert argument of type \'",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&argtypes - lVar3));
  std::operator+(&local_a8,&local_c8,"\' to Python object");
  cast_error::runtime_error(this_00,&local_a8);
  __cxa_throw(this_00,&cast_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

tuple make_tuple(Args&&... args_) {
    constexpr size_t size = sizeof...(Args);
    std::array<object, size> args {
        { reinterpret_steal<object>(detail::make_caster<Args>::cast(
            std::forward<Args>(args_), policy, nullptr))... }
    };
    for (size_t i = 0; i < args.size(); i++) {
        if (!args[i]) {
#if defined(NDEBUG)
            throw cast_error("make_tuple(): unable to convert arguments to Python object (compile in debug mode for details)");
#else
            std::array<std::string, size> argtypes { {type_id<Args>()...} };
            throw cast_error("make_tuple(): unable to convert argument of type '" +
                argtypes[i] + "' to Python object");
#endif
        }
    }
    tuple result(size);
    int counter = 0;
    for (auto &arg_value : args)
        PyTuple_SET_ITEM(result.ptr(), counter++, arg_value.release().ptr());
    return result;
}